

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsStoreFS::Write<tcu::Vector<unsigned_int,4>>
          (BasicAllFormatsStoreFS *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  ulong uVar1;
  _Alloc_hider _Var2;
  Vector<unsigned_int,_4> *pVVar3;
  _func_int **pp_Var4;
  GLuint program;
  GLuint program_00;
  ostream *poVar5;
  void *__s;
  uint *puVar6;
  uint *puVar7;
  GLenum e;
  GLenum e_00;
  Vector<unsigned_int,_4> *extraout_RDX;
  Vector<unsigned_int,_4> *v;
  Vector<unsigned_int,_4> *v_00;
  undefined4 in_register_00000034;
  uint *puVar8;
  ulong uVar9;
  bool bVar10;
  string local_268;
  string local_248;
  ShaderImageLoadStoreBase *local_228;
  GLuint m_buffer;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  void *local_200;
  void *local_1f8;
  Vector<unsigned_int,_4> *local_1f0;
  GLuint texture;
  undefined4 uStack_1e4;
  long local_1d8 [2];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostringstream os;
  
  local_228 = (ShaderImageLoadStoreBase *)CONCAT44(in_register_00000034,internalformat);
  local_1f0 = expected_value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,"\nlayout(",8);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_248,local_228,e);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,", binding = 2) writeonly uniform ",0x21);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_268._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_268._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, "
             ,100);
  local_210._M_allocated_capacity._0_2_ = 0x75;
  local_218 = 1;
  _m_buffer = (pointer)&local_210;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_210._M_local_buf,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"vec4",4);
  poVar5 = tcu::operator<<(poVar5,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n  discard;\n}",0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_m_buffer != &local_210) {
    operator_delete(_m_buffer,
                    CONCAT62(local_210._M_allocated_capacity._2_6_,
                             local_210._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT62(local_248.field_2._M_allocated_capacity._2_6_,
                             local_248.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)CONCAT44(uStack_1e4,texture),false,false);
  if ((long *)CONCAT44(uStack_1e4,texture) != local_1d8) {
    operator_delete((long *)CONCAT44(uStack_1e4,texture),local_1d8[0] + 1);
  }
  local_1f8 = operator_new(0x790);
  memset(local_1f8,0,0x790);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,(GLenum)local_228,0xb,0xb);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,0xb,0xb);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,texture,0,'\0',0,0x88b9,(GLenum)local_228);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nuniform "
             ,0x52);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_248._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_248._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"sampler2D g_sampler;\nlayout(std430) buffer OutputBuffer {\n  ",0x3c);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_268._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_268._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  data[gl_LocalInvocationIndex] = texelFetch(g_sampler, ivec2(gl_LocalInvocationID), 0);\n  //data[gl_LocalInvocationIndex] = "
             ,0xa6);
  poVar5 = tcu::operator<<(poVar5,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n}",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT62(local_248.field_2._M_allocated_capacity._2_6_,
                             local_248.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program_00 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,(string *)&m_buffer,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_m_buffer != &local_210) {
    operator_delete(_m_buffer,
                    CONCAT62(local_210._M_allocated_capacity._2_6_,
                             local_210._M_allocated_capacity._0_2_) + 1);
  }
  __s = operator_new(0x790);
  pVVar3 = local_1f0;
  memset(__s,0,0x790);
  local_200 = __s;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x790,__s,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,program_00);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x790,1);
  if (*puVar6 == pVVar3->m_data[0]) {
    v = (Vector<unsigned_int,_4> *)(ulong)pVVar3->m_data[1];
    bVar10 = false;
    puVar8 = puVar6;
    uVar9 = 0;
    do {
      puVar7 = puVar6 + uVar9 * 4;
      if (((puVar8[1] != pVVar3->m_data[1]) || (puVar8[2] != pVVar3->m_data[2])) ||
         (puVar7 = puVar8, puVar8[3] != pVVar3->m_data[3])) goto LAB_00c3fbb9;
      uVar1 = uVar9 + 1;
      bVar10 = 0x77 < uVar9;
      if (uVar9 == 0x78) {
        glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,program);
        glu::CallLogWrapper::glDeleteProgram(this_00,program_00);
        bVar10 = true;
        glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
        goto LAB_00c3fcde;
      }
      puVar7 = puVar8 + 4;
      puVar8 = puVar8 + 4;
      uVar9 = uVar1;
    } while (*puVar7 == pVVar3->m_data[0]);
    puVar7 = puVar6 + uVar1 * 4;
  }
  else {
    bVar10 = false;
    puVar7 = puVar6;
    v = extraout_RDX;
    uVar9 = 0;
  }
LAB_00c3fbb9:
  local_1b8 = *(undefined8 *)puVar7;
  uStack_1b0 = *(undefined8 *)(puVar7 + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
            ((string *)&os,(ShaderImageLoadStoreBase *)&local_1b8,v);
  pp_Var4 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  local_1c8 = *(undefined8 *)local_1f0->m_data;
  uStack_1c0 = *(undefined8 *)(local_1f0->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
            (&local_248,(ShaderImageLoadStoreBase *)&local_1c8,v_00);
  _Var2._M_p = local_248._M_dataplus._M_p;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_268,local_228,e_00);
  glcts::anon_unknown_0::Output
            ("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
             uVar9 & 0xffffffff,pp_Var4,_Var2._M_p,local_268._M_dataplus._M_p,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  __s = local_200;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT62(local_248.field_2._M_allocated_capacity._2_6_,
                             local_248.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  glu::CallLogWrapper::glDeleteProgram(this_00,program_00);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
LAB_00c3fcde:
  operator_delete(__s,0x790);
  operator_delete(local_1f8,0x790);
  return bVar10;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		GLuint		   program = BuildProgram(src_vs, GenFS(internalformat, write_value).c_str());
		const int	  kSize   = 11;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture;
		glGenTextures(1, &texture);
		glUseProgram(program);

		GLuint unit = 2;
		glBindTexture(GL_TEXTURE_2D, texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		glBindTexture(GL_TEXTURE_2D, 0);

		glViewport(0, 0, kSize, kSize);
		glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glBindTexture(GL_TEXTURE_2D, texture);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(write_value));
		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n", i,
					   ToString(map_data[i]).c_str(), ToString(expected_value).c_str(),
					   FormatEnumToString(internalformat).c_str(), unit);
				glDeleteTextures(1, &texture);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteProgram(c_program);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(1, &m_buffer);
		return true;
	}